

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

void TTA::Dealloc(void)

{
  if (rtable_ != (uint *)0x0) {
    operator_delete__(rtable_);
  }
  if (next_ != (uint *)0x0) {
    operator_delete__(next_);
  }
  if (tail_ != (uint *)0x0) {
    operator_delete__(tail_);
    return;
  }
  return;
}

Assistant:

static void Dealloc() {
        delete[] rtable_;
        delete[] next_;
        delete[] tail_;
    }